

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-unwrap.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *pFVar1;
  undefined8 uVar2;
  int iVar3;
  FileReaderFactory defaultFactory;
  EssenceType_t EssenceType;
  CommandOptions Options;
  Result_t result;
  allocator<char> local_195;
  undefined1 local_194 [108];
  _Alloc_hider local_128 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  CommandOptions local_108;
  int local_78 [26];
  
  Kumu::Result_t::Result_t((Result_t *)local_78,(Result_t *)Kumu::RESULT_OK);
  CommandOptions::CommandOptions(&local_108,argc,argv);
  pFVar1 = _stdout;
  if (local_108.version_flag == true) {
    uVar2 = ASDCP::Version();
    fprintf(pFVar1,
            "\n%s (asdcplib %s)\n\nCopyright (c) 2003-2015 John Hurst\n\nasdcplib may be copied only under the terms of the license found at\nthe top of every file in the asdcplib distribution kit.\n\nSpecify the -h (help) option for further information about %s\n\n"
            ,"asdcp-unwrap",uVar2,"asdcp-unwrap");
  }
  pFVar1 = _stdout;
  if (local_108.help_flag == true) {
    fprintf(_stdout,
            "USAGE: %s [-h|-help] [-V]\n\n       %s -G [-v] <input-file>\n\n       %s [-1|-2] [-3] [-b <buffer-size>] [-d <duration>]\n       [-f <starting-frame>] [-m] [-p <frame-rate>] [-R] [-s <size>] [-v] [-W]\n       [-w] <input-file> [<file-prefix>]\n\n"
            ,"asdcp-unwrap","asdcp-unwrap","asdcp-unwrap");
    fwrite("Options:\n  -1                - Split Wave essence to mono WAV files during extract.\n                      Default is multichannel WAV\n  -2                - Split Wave essence to stereo WAV files during extract.\n                      Default is multichannel WAV\n  -3                - Force stereoscopic interpretation of a JP2K file.\n  -b <buffer-size>  - Specify size in bytes of picture frame buffer\n                      Defaults to 4,194,304 (4MB)\n  -d <duration>     - Number of frames to process, default all\n  -e <extension>    - Extension to use for Unknown D-Cinema Data files. default dcdata\n  -f <start-frame>  - Starting frame number, default 0\n                  -G                - Perform GOP start lookup test on MXF+Interop MPEG file\n  -h | -help        - Show help\n  -k <key-string>   - Use key for ciphertext operations\n  -m                - verify HMAC values when reading\n  -p <rate>         - Alternative picture rate when unwrapping PCM:\n                      Use one of [23|24|25|30|48|50|60], 24 is default\n  -s <size>         - Number of bytes to dump to output when -v is given\n  -V                - Show version information\n  -v                - Verbose, prints informative messages to stderr\n  -W                - Read input file only, do not write destination file\n  -w <width>        - Width of numeric element in a series of frame file names\n                      (default 6)\n  -z                - Fail if j2c inputs have unequal parameters (default)\n  -Z                - Ignore unequal parameters in j2c inputs\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n         o An argument of \"23\" to the -p option will be interpreted\n           as 24000/1001 fps.\n\n"
           ,0x70c,1,pFVar1);
  }
  iVar3 = 0;
  if ((local_108.version_flag != false) || (iVar3 = 0, local_108.help_flag != false))
  goto LAB_0010a9c8;
  if (local_108.error_flag == true) {
    main_cold_2();
    iVar3 = 3;
    goto LAB_0010a9c8;
  }
  if (local_108.mode == MMT_EXTRACT) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128,local_108.input_filename,&local_195);
    ASDCP::EssenceType((string *)(local_194 + 4),(EssenceType_t *)local_128,
                       (IFileReaderFactory *)local_194);
    Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)(local_194 + 4));
    Kumu::Result_t::~Result_t((Result_t *)(local_194 + 4));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128[0]._M_p != &local_118) {
      operator_delete(local_128[0]._M_p,local_118._M_allocated_capacity + 1);
    }
    if (-1 < local_78[0]) {
      switch(local_194._0_4_) {
      case 1:
        read_MPEG2_file((CommandOptions *)(local_194 + 4),(IFileReaderFactory *)&local_108);
        Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)(local_194 + 4));
        break;
      case 2:
        if (local_108.stereo_image_flag == true) {
          read_JP2K_S_file((CommandOptions *)(local_194 + 4),(IFileReaderFactory *)&local_108);
          Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)(local_194 + 4));
        }
        else {
          read_JP2K_file((CommandOptions *)(local_194 + 4),(IFileReaderFactory *)&local_108);
          Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)(local_194 + 4));
        }
        break;
      case 3:
      case 4:
        read_PCM_file((CommandOptions *)(local_194 + 4),(IFileReaderFactory *)&local_108);
        Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)(local_194 + 4));
        break;
      case 5:
        read_timed_text_file((CommandOptions *)(local_194 + 4),(IFileReaderFactory *)&local_108);
        Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)(local_194 + 4));
        break;
      case 6:
        read_JP2K_S_file((CommandOptions *)(local_194 + 4),(IFileReaderFactory *)&local_108);
        Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)(local_194 + 4));
        break;
      case 7:
        read_DCData_file((CommandOptions *)(local_194 + 4),(IFileReaderFactory *)&local_108);
        Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)(local_194 + 4));
        break;
      case 8:
        local_108.extension = "atmos";
        read_DCData_file((CommandOptions *)(local_194 + 4),(IFileReaderFactory *)&local_108);
        Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)(local_194 + 4));
        break;
      default:
        fprintf(_stderr,"%s: Unknown file type, not ASDCP essence.\n",local_108.input_filename);
        iVar3 = 5;
        goto LAB_0010a9c8;
      }
      goto LAB_0010a9ae;
    }
  }
  else {
    if (local_108.mode != MMT_GOP_START) {
      fprintf(_stderr,"Unhandled mode: %d.\n");
      iVar3 = 6;
      goto LAB_0010a9c8;
    }
    gop_start_test((CommandOptions *)(local_194 + 4),(IFileReaderFactory *)&local_108);
    Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)(local_194 + 4));
LAB_0010a9ae:
    Kumu::Result_t::~Result_t((Result_t *)(local_194 + 4));
  }
  iVar3 = 0;
  if (local_78[0] < 0) {
    main_cold_1();
    iVar3 = local_194._4_4_;
  }
LAB_0010a9c8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.prefix_buffer._M_dataplus._M_p != &local_108.prefix_buffer.field_2) {
    operator_delete(local_108.prefix_buffer._M_dataplus._M_p,
                    local_108.prefix_buffer.field_2._M_allocated_capacity + 1);
  }
  Kumu::Result_t::~Result_t((Result_t *)local_78);
  return iVar3;
}

Assistant:

int
main(int argc, const char** argv)
{
  Result_t result = RESULT_OK;
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  Kumu::FileReaderFactory defaultFactory;

  if ( Options.mode == MMT_GOP_START )
    {
      result = gop_start_test(Options, defaultFactory);
    }
  else if ( Options.mode == MMT_EXTRACT )
    {
      EssenceType_t EssenceType;
      result = ASDCP::EssenceType(Options.input_filename, EssenceType, defaultFactory);

      if ( ASDCP_SUCCESS(result) )
	{
	  switch ( EssenceType )
	    {
	    case ESS_MPEG2_VES:
          result = read_MPEG2_file(Options, defaultFactory);
	      break;

	    case ESS_JPEG_2000:
	      if ( Options.stereo_image_flag )
        result = read_JP2K_S_file(Options, defaultFactory);
	      else
        result = read_JP2K_file(Options, defaultFactory);
	      break;

	    case ESS_JPEG_2000_S:
          result = read_JP2K_S_file(Options, defaultFactory);
	      break;

	    case ESS_PCM_24b_48k:
	    case ESS_PCM_24b_96k:
          result = read_PCM_file(Options, defaultFactory);
	      break;

	    case ESS_TIMED_TEXT:
          result = read_timed_text_file(Options, defaultFactory);
	      break;

        case ESS_DCDATA_UNKNOWN:
          result = read_DCData_file(Options, defaultFactory);
          break;

        case ESS_DCDATA_DOLBY_ATMOS:
          Options.extension = "atmos";
          result = read_DCData_file(Options, defaultFactory);
          break;

	    default:
	      fprintf(stderr, "%s: Unknown file type, not ASDCP essence.\n", Options.input_filename);
	      return 5;
	    }
	}
    }
  else
    {
      fprintf(stderr, "Unhandled mode: %d.\n", Options.mode);
      return 6;
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result == RESULT_SFORMAT )
	{
	  fputs("Use option '-3' to force stereoscopic mode.\n", stderr);
	}
      else if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}